

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmMakefile::DeferGetCall
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmMakefile *this,string *id)

{
  DeferCommands *pDVar1;
  pointer pDVar2;
  pointer __s2;
  size_t __n;
  long lVar3;
  undefined8 *puVar4;
  int iVar5;
  pointer pDVar6;
  cmListFileArgument *arg;
  undefined8 *puVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  string local_80;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pDVar1 = (this->Defer)._M_t.
           super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
           .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl;
  if (pDVar1 != (DeferCommands *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    pDVar6 = *(pointer *)
              &(pDVar1->Commands).
               super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
    ;
    pDVar2 = *(pointer *)
              ((long)&(pDVar1->Commands).
                      super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
              + 8);
    if (pDVar6 != pDVar2) {
      __s2 = (id->_M_dataplus)._M_p;
      __n = id->_M_string_length;
      do {
        if (((pDVar6->Id)._M_string_length == __n) &&
           ((__n == 0 || (iVar5 = bcmp((pDVar6->Id)._M_dataplus._M_p,__s2,__n), iVar5 == 0)))) {
          std::__cxx11::string::_M_assign((string *)&local_d0);
          lVar3 = *(long *)&(pDVar6->Command).Impl.
                            super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
          ;
          puVar7 = *(undefined8 **)(lVar3 + 0x50);
          puVar4 = *(undefined8 **)(lVar3 + 0x58);
          if (puVar7 != puVar4) {
            do {
              local_60 = 1;
              local_50[0] = 0x3b;
              local_b0._M_len = local_d0._M_string_length;
              local_b0._M_str = local_d0._M_dataplus._M_p;
              local_a0 = 1;
              local_88 = *puVar7;
              local_90 = puVar7[1];
              views._M_len = 3;
              views._M_array = &local_b0;
              local_98 = local_50;
              local_58 = local_50;
              cmCatViews_abi_cxx11_(&local_80,views);
              std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              puVar7 = puVar7 + 6;
            } while (puVar7 != puVar4);
          }
          break;
        }
        pDVar6 = pDVar6 + 1;
      } while (pDVar6 != pDVar2);
    }
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> cmMakefile::DeferGetCall(std::string const& id) const
{
  cm::optional<std::string> call;
  if (this->Defer) {
    std::string tmp;
    for (DeferCommand const& dc : this->Defer->Commands) {
      if (dc.Id == id) {
        tmp = dc.Command.OriginalName();
        for (cmListFileArgument const& arg : dc.Command.Arguments()) {
          tmp = cmStrCat(tmp, ';', arg.Value);
        }
        break;
      }
    }
    call = std::move(tmp);
  }
  return call;
}